

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

string * __thiscall
cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
          (string *__return_storage_ptr__,cmRuntimeDependencyArchive *this)

{
  cmMakefile *this_00;
  string *psVar1;
  allocator<char> local_39;
  string local_38;
  cmRuntimeDependencyArchive *local_18;
  cmRuntimeDependencyArchive *this_local;
  
  local_18 = this;
  this_local = (cmRuntimeDependencyArchive *)__return_storage_ptr__;
  this_00 = GetMakefile(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL",&local_39);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool()
{
  return this->GetMakefile()->GetSafeDefinition(
    "CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL");
}